

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::BaseBuilder::comment(BaseBuilder *this,char *data,size_t size)

{
  Error EVar1;
  CommentNode *in_RAX;
  CommentNode *node;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar1 = 5;
  }
  else {
    node = in_RAX;
    EVar1 = _newCommentNode(this,&node,data,size);
    if (EVar1 == 0) {
      addNode(this,&node->super_BaseNode);
    }
  }
  return EVar1;
}

Assistant:

Error BaseBuilder::comment(const char* data, size_t size) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  CommentNode* node;
  ASMJIT_PROPAGATE(_newCommentNode(&node, data, size));

  addNode(node);
  return kErrorOk;
}